

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_heat_maps_test.cpp
# Opt level: O3

void __thiscall check_median_of_heat_maps::test_method(check_median_of_heat_maps *this)

{
  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
  to_compute_median;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> median;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  template_median;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> r;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> q;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> p;
  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
  local_408;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3b8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3a0;
  undefined1 local_388;
  undefined8 local_380;
  shared_count sStack_378;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_370;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_298;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_200;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_168;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_d0;
  undefined **local_38;
  undefined1 local_30;
  undefined8 *local_28;
  char **local_20;
  
  Gudhi::Persistence_representations::create_Gaussian_filter(&local_3e8,0x1e,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_3a0,&local_3e8);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps(&local_d0,"data/file_with_diagram",&local_3a0,false,1000,0.0,1.0,0xffffffff)
  ;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_3a0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_3b8,&local_3e8);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            (&local_168,"data/file_with_diagram_1",&local_3b8,false,1000,0.0,1.0,0xffffffff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_3b8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_3d0,&local_3e8);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            (&local_200,"data/file_with_diagram_2",&local_3d0,false,1000,0.0,1.0,0xffffffff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_3d0);
  local_408.
  super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.
  super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_370.number_of_functions_for_vectorization = (size_t)&local_d0;
  std::
  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*,std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*>>
  ::
  emplace_back<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*>
            ((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*,std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*>>
              *)&local_408,
             (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
              **)&local_370);
  local_370.number_of_functions_for_vectorization = (size_t)&local_168;
  std::
  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*,std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*>>
  ::
  emplace_back<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*>
            ((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*,std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*>>
              *)&local_408,
             (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
              **)&local_370);
  local_370.number_of_functions_for_vectorization = (size_t)&local_200;
  std::
  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*,std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*>>
  ::
  emplace_back<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*>
            ((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*,std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>*>>
              *)&local_408,
             (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
              **)&local_370);
  local_370.discrete = true;
  local_370.erase_below_diagonal = false;
  local_370.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_370.kernel.super__Function_base._M_functor._8_8_ = 0;
  local_370.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
  local_370.kernel._M_invoker = (_Invoker_type)0x0;
  local_370.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_370.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_370.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_370.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_370.min_ = 0.0;
  local_370.max_ = 0.0;
  local_370.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_370.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_370.number_of_functions_for_vectorization = 1;
  local_370.number_of_functions_for_projections_to_reals = 1;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  compute_median(&local_370,&local_408);
  local_298.discrete = true;
  local_298.erase_below_diagonal = false;
  local_298.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_298.kernel.super__Function_base._M_functor._8_8_ = 0;
  local_298.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
  local_298.kernel._M_invoker = (_Invoker_type)0x0;
  local_298.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.min_ = 0.0;
  local_298.max_ = 0.0;
  local_298.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.number_of_functions_for_vectorization = 1;
  local_298.number_of_functions_for_projections_to_reals = 1;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file(&local_298,"data/template_median_of_heat_maps");
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a8,0x43);
  local_388 = Gudhi::Persistence_representations::
              Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
              operator==(&local_370,&local_298);
  local_380 = 0;
  sStack_378.pi_ = (sp_counted_base *)0x0;
  local_20 = &local_2c8;
  local_2c8 = "median == template_median";
  local_2c0 = "";
  local_30 = 0;
  local_38 = &PTR__lazy_ostream_00113d30;
  local_28 = &boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_2d0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_378);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_298.heat_map);
  if (local_298.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_298.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_298.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_298.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_298.kernel,(_Any_data *)&local_298.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_370.heat_map);
  if (local_370.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_370.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_370.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_370.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_370.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_370.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_370.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_370.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_370.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_370.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_370.kernel,(_Any_data *)&local_370.kernel,__destroy_functor);
  }
  if (local_408.
      super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_200.heat_map);
  if (local_200.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_200.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_200.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_200.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_200.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_200.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_200.kernel,(_Any_data *)&local_200.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_168.heat_map);
  if (local_168.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_168.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_168.kernel,(_Any_data *)&local_168.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_d0.heat_map);
  if (local_d0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d0.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_d0.kernel,(_Any_data *)&local_d0.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_3e8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_median_of_heat_maps) {
  std::vector<std::vector<double> > filter = create_Gaussian_filter(30, 1);
  Persistence_heat_maps<constant_scaling_function> p("data/file_with_diagram", filter, false, 1000, 0, 1);
  Persistence_heat_maps<constant_scaling_function> q("data/file_with_diagram_1", filter, false, 1000, 0, 1);
  Persistence_heat_maps<constant_scaling_function> r("data/file_with_diagram_2", filter, false, 1000, 0, 1);

  std::vector<Persistence_heat_maps<constant_scaling_function>*> to_compute_median;
  to_compute_median.push_back(&p);
  to_compute_median.push_back(&q);
  to_compute_median.push_back(&r);
  Persistence_heat_maps<constant_scaling_function> median;
  median.compute_median(to_compute_median);

  Persistence_heat_maps<constant_scaling_function> template_median;
  template_median.load_from_file("data/template_median_of_heat_maps");

  BOOST_CHECK(median == template_median);
}